

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O3

void predict_or_learn_bandit_adf<false>(warm_cb *data,multi_learner *base,example *ec,int ec_type)

{
  action_score *paVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  vw_exception *this;
  stringstream __msg;
  string sStack_1c8;
  stringstream local_1a8 [16];
  ostream local_198;
  
  uVar2 = predict_bandit_adf(data,base,ec);
  paVar1 = (data->a_s_adf)._begin;
  uVar3 = paVar1[uVar2].action + 1;
  (data->cl_adf).action = uVar3;
  (data->cl_adf).probability = paVar1[uVar2].score;
  if (uVar3 == 0) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_198,"No action with non-zero probability found!",0x2a);
    this = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/warm_cb.cc"
               ,0x1cb,&sStack_1c8);
    __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  (data->cl_adf).cost = (&data->loss0)[(ec->l).multi.label != uVar3];
  if (ec_type == 2) {
    accumu_costs_iv_adf(data,base,ec);
    if (data->upd_inter != true) goto LAB_001e33e4;
  }
  else if (*(char *)((long)&(data->cb_label).costs._begin + ((ulong)(ec_type == 1) ^ 0x85)) == '\0')
  goto LAB_001e33e4;
  learn_bandit_adf(data,base,ec,ec_type);
LAB_001e33e4:
  (ec->pred).scalar = (float)(data->cl_adf).action;
  return;
}

Assistant:

void predict_or_learn_bandit_adf(warm_cb& data, multi_learner& base, example& ec, int ec_type)
{
	uint32_t chosen_action = predict_bandit_adf(data, base, ec);

	auto& cl = data.cl_adf;
	auto& a_s = data.a_s_adf;
	cl.action = a_s[chosen_action].action + 1;
	cl.probability = a_s[chosen_action].score;

	if(!cl.action)
		THROW("No action with non-zero probability found!");

	if (use_cs)
		cl.cost = loss_cs(data, ec.l.cs.costs, cl.action);
	else
		cl.cost = loss(data, ec.l.multi.label, cl.action);

	if (ec_type == INTERACTION)
		accumu_costs_iv_adf(data, base, ec);

	if (ind_update(data, ec_type))
		learn_bandit_adf(data, base, ec, ec_type);

	ec.pred.multiclass = cl.action;
}